

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_searcher.cc
# Opt level: O0

bool __thiscall
gss::innards::HomomorphismSearcher::propagate_occur_less_thans
          (HomomorphismSearcher *this,
          optional<gss::innards::HomomorphismAssignment> *current_assignment,
          HomomorphismAssignments *assignments,Domains *new_domains)

{
  bool bVar1;
  reference pHVar2;
  HomomorphismAssignment *pHVar3;
  reference pHVar4;
  uint uVar5;
  undefined8 in_RCX;
  undefined8 in_RDX;
  SVOBitset *in_RDI;
  HomomorphismAssignmentInformation *d_3;
  const_iterator __end3_3;
  const_iterator __begin3_3;
  vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
  *__range3_3;
  HomomorphismDomain *d_2;
  iterator __end3_2;
  iterator __begin3_2;
  Domains *__range3_2;
  bool saw_an_a;
  type *b_2;
  type *a_3;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *__range2;
  HomomorphismDomain *d_1;
  iterator __end3_1;
  iterator __begin3_1;
  Domains *__range3_1;
  HomomorphismDomain *d;
  iterator __end3;
  iterator __begin3;
  Domains *__range3;
  uint first_a;
  type *b_1;
  type *a_2;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *__range1_2;
  HomomorphismAssignmentInformation *a_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
  *__range1_1;
  type *b;
  type *a;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *__range1;
  anon_class_24_3_9ba074a0 build_occurs;
  vector<std::optional<gss::innards::SVOBitset>,_std::allocator<std::optional<gss::innards::SVOBitset>_>_>
  occurs;
  vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
  *in_stack_fffffffffffffe08;
  uint in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  uint in_stack_fffffffffffffe20;
  type_conflict4 in_stack_fffffffffffffe24;
  undefined2 in_stack_fffffffffffffe28;
  undefined1 in_stack_fffffffffffffe2a;
  undefined1 in_stack_fffffffffffffe2b;
  uint in_stack_fffffffffffffe2c;
  __normal_iterator<const_gss::innards::HomomorphismAssignmentInformation_*,_std::vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>_>
  local_1a8;
  undefined8 local_1a0;
  reference local_198;
  HomomorphismDomain *local_190;
  __normal_iterator<gss::innards::HomomorphismDomain_*,_std::vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>_>
  local_188;
  undefined8 local_180;
  byte local_171;
  type_conflict4 *local_170;
  uint *local_168;
  reference local_160;
  pair<unsigned_int,_unsigned_int> *local_158;
  __normal_iterator<const_std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
  local_150;
  long local_148;
  reference local_140;
  HomomorphismDomain *local_138;
  __normal_iterator<gss::innards::HomomorphismDomain_*,_std::vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>_>
  local_130;
  undefined8 local_128;
  undefined4 local_11c;
  undefined8 in_stack_fffffffffffffee8;
  anon_class_24_3_9ba074a0 *in_stack_fffffffffffffef0;
  __normal_iterator<gss::innards::HomomorphismDomain_*,_std::vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>_>
  local_108;
  undefined8 local_100;
  uint local_f4;
  uint *local_f0;
  uint *local_e8;
  reference local_e0;
  pair<unsigned_int,_unsigned_int> *local_d8;
  __normal_iterator<const_std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
  local_d0;
  long local_c8;
  reference local_c0;
  HomomorphismAssignmentInformation *local_b8;
  __normal_iterator<const_gss::innards::HomomorphismAssignmentInformation_*,_std::vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>_>
  local_b0;
  undefined8 local_a8;
  type_conflict4 *local_a0;
  type_conflict4 *local_98;
  reference local_90;
  pair<unsigned_int,_unsigned_int> *local_88;
  __normal_iterator<const_std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
  local_80;
  long local_78;
  vector<std::optional<gss::innards::SVOBitset>,_std::allocator<std::optional<gss::innards::SVOBitset>_>_>
  *local_70;
  undefined8 local_60;
  allocator<std::optional<gss::innards::SVOBitset>_> local_41;
  vector<std::optional<gss::innards::SVOBitset>,_std::allocator<std::optional<gss::innards::SVOBitset>_>_>
  local_40;
  undefined8 local_28;
  undefined8 local_20;
  byte local_1;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  std::allocator<std::optional<gss::innards::SVOBitset>_>::allocator
            ((allocator<std::optional<gss::innards::SVOBitset>_> *)0x178521);
  std::
  vector<std::optional<gss::innards::SVOBitset>,_std::allocator<std::optional<gss::innards::SVOBitset>_>_>
  ::vector((vector<std::optional<gss::innards::SVOBitset>,_std::allocator<std::optional<gss::innards::SVOBitset>_>_>
            *)in_RDI,
           CONCAT44(in_stack_fffffffffffffe2c,
                    CONCAT13(in_stack_fffffffffffffe2b,
                             CONCAT12(in_stack_fffffffffffffe2a,in_stack_fffffffffffffe28))),
           (allocator_type *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
  std::allocator<std::optional<gss::innards::SVOBitset>_>::~allocator(&local_41);
  local_70 = &local_40;
  local_60 = local_28;
  local_78 = (in_RDI->_data).short_data[0] + 0x30;
  local_80._M_current =
       (pair<unsigned_int,_unsigned_int> *)
       std::
       vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
       ::begin((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                *)in_stack_fffffffffffffe08);
  local_88 = (pair<unsigned_int,_unsigned_int> *)
             std::
             vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             ::end((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                    *)in_stack_fffffffffffffe08);
  while (bVar1 = __gnu_cxx::
                 operator==<const_std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
                           ((__normal_iterator<const_std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                            (__normal_iterator<const_std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
                             *)in_stack_fffffffffffffe08), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_90 = __gnu_cxx::
               __normal_iterator<const_std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
               ::operator*(&local_80);
    local_98 = std::get<0ul,unsigned_int,unsigned_int>((pair<unsigned_int,_unsigned_int> *)0x1785ef)
    ;
    local_a0 = std::get<1ul,unsigned_int,unsigned_int>((pair<unsigned_int,_unsigned_int> *)0x178604)
    ;
    propagate_occur_less_thans::anon_class_24_3_9ba074a0::operator()
              (in_stack_fffffffffffffef0,(int)((ulong)in_stack_fffffffffffffee8 >> 0x20));
    propagate_occur_less_thans::anon_class_24_3_9ba074a0::operator()
              (in_stack_fffffffffffffef0,(int)((ulong)in_stack_fffffffffffffee8 >> 0x20));
    __gnu_cxx::
    __normal_iterator<const_std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
    ::operator++(&local_80);
  }
  local_a8 = local_20;
  local_b0._M_current =
       (HomomorphismAssignmentInformation *)
       std::
       vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
       ::begin(in_stack_fffffffffffffe08);
  local_b8 = (HomomorphismAssignmentInformation *)
             std::
             vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
             ::end(in_stack_fffffffffffffe08);
  while (bVar1 = __gnu_cxx::
                 operator==<const_gss::innards::HomomorphismAssignmentInformation_*,_std::vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>_>
                           ((__normal_iterator<const_gss::innards::HomomorphismAssignmentInformation_*,_std::vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>_>
                             *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                            (__normal_iterator<const_gss::innards::HomomorphismAssignmentInformation_*,_std::vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>_>
                             *)in_stack_fffffffffffffe08), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_c0 = __gnu_cxx::
               __normal_iterator<const_gss::innards::HomomorphismAssignmentInformation_*,_std::vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>_>
               ::operator*(&local_b0);
    std::
    vector<std::optional<gss::innards::SVOBitset>,_std::allocator<std::optional<gss::innards::SVOBitset>_>_>
    ::operator[](&local_40,(ulong)(local_c0->assignment).target_vertex);
    bVar1 = std::optional::operator_cast_to_bool((optional<gss::innards::SVOBitset> *)0x17872f);
    if (bVar1) {
      std::
      vector<std::optional<gss::innards::SVOBitset>,_std::allocator<std::optional<gss::innards::SVOBitset>_>_>
      ::operator[](&local_40,(ulong)(local_c0->assignment).target_vertex);
      std::optional<gss::innards::SVOBitset>::operator->
                ((optional<gss::innards::SVOBitset> *)0x178757);
      SVOBitset::set(in_RDI,in_stack_fffffffffffffe2c);
    }
    __gnu_cxx::
    __normal_iterator<const_gss::innards::HomomorphismAssignmentInformation_*,_std::vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>_>
    ::operator++(&local_b0);
  }
  local_c8 = (in_RDI->_data).short_data[0] + 0x30;
  local_d0._M_current =
       (pair<unsigned_int,_unsigned_int> *)
       std::
       vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
       ::begin((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                *)in_stack_fffffffffffffe08);
  local_d8 = (pair<unsigned_int,_unsigned_int> *)
             std::
             vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             ::end((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                    *)in_stack_fffffffffffffe08);
  while (bVar1 = __gnu_cxx::
                 operator==<const_std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
                           ((__normal_iterator<const_std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                            (__normal_iterator<const_std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
                             *)in_stack_fffffffffffffe08), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_e0 = __gnu_cxx::
               __normal_iterator<const_std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
               ::operator*(&local_d0);
    local_e8 = std::get<0ul,unsigned_int,unsigned_int>((pair<unsigned_int,_unsigned_int> *)0x178801)
    ;
    local_f0 = std::get<1ul,unsigned_int,unsigned_int>((pair<unsigned_int,_unsigned_int> *)0x178816)
    ;
    std::
    vector<std::optional<gss::innards::SVOBitset>,_std::allocator<std::optional<gss::innards::SVOBitset>_>_>
    ::operator[](&local_40,(ulong)*local_e8);
    std::optional<gss::innards::SVOBitset>::operator->
              ((optional<gss::innards::SVOBitset> *)0x17883f);
    in_stack_fffffffffffffe2c =
         SVOBitset::find_first
                   ((SVOBitset *)
                    CONCAT44(in_stack_fffffffffffffe2c,
                             CONCAT13(in_stack_fffffffffffffe2b,
                                      CONCAT12(in_stack_fffffffffffffe2a,in_stack_fffffffffffffe28))
                            ));
    local_f4 = in_stack_fffffffffffffe2c;
    if (in_stack_fffffffffffffe2c == 0xffffffff) {
      std::
      vector<std::optional<gss::innards::SVOBitset>,_std::allocator<std::optional<gss::innards::SVOBitset>_>_>
      ::operator[](&local_40,(ulong)*local_f0);
      std::optional<gss::innards::SVOBitset>::operator->
                ((optional<gss::innards::SVOBitset> *)0x178887);
      SVOBitset::reset((SVOBitset *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
      local_100 = local_28;
      local_108._M_current =
           (HomomorphismDomain *)
           std::
           vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
           ::begin((vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
                    *)in_stack_fffffffffffffe08);
      std::
      vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>::
      end((vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
           *)in_stack_fffffffffffffe08);
      while (bVar1 = __gnu_cxx::
                     operator==<gss::innards::HomomorphismDomain_*,_std::vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>_>
                               ((__normal_iterator<gss::innards::HomomorphismDomain_*,_std::vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                                (__normal_iterator<gss::innards::HomomorphismDomain_*,_std::vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>_>
                                 *)in_stack_fffffffffffffe08), ((bVar1 ^ 0xffU) & 1) != 0) {
        pHVar2 = __gnu_cxx::
                 __normal_iterator<gss::innards::HomomorphismDomain_*,_std::vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>_>
                 ::operator*(&local_108);
        in_stack_fffffffffffffe2b = SVOBitset::test(in_RDI,in_stack_fffffffffffffe2c);
        if ((bool)in_stack_fffffffffffffe2b) {
          SVOBitset::reset(in_RDI,in_stack_fffffffffffffe2c);
          uVar5 = pHVar2->count - 1;
          pHVar2->count = uVar5;
          if (uVar5 == 0) {
            local_1 = 0;
            goto LAB_00178e4a;
          }
        }
        __gnu_cxx::
        __normal_iterator<gss::innards::HomomorphismDomain_*,_std::vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>_>
        ::operator++(&local_108);
      }
    }
    else {
      local_128 = local_28;
      local_130._M_current =
           (HomomorphismDomain *)
           std::
           vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
           ::begin((vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
                    *)in_stack_fffffffffffffe08);
      local_138 = (HomomorphismDomain *)
                  std::
                  vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
                  ::end((vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
                         *)in_stack_fffffffffffffe08);
      while (bVar1 = __gnu_cxx::
                     operator==<gss::innards::HomomorphismDomain_*,_std::vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>_>
                               ((__normal_iterator<gss::innards::HomomorphismDomain_*,_std::vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                                (__normal_iterator<gss::innards::HomomorphismDomain_*,_std::vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>_>
                                 *)in_stack_fffffffffffffe08), ((bVar1 ^ 0xffU) & 1) != 0) {
        local_140 = __gnu_cxx::
                    __normal_iterator<gss::innards::HomomorphismDomain_*,_std::vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>_>
                    ::operator*(&local_130);
        if ((local_140->v < local_f4) &&
           (in_stack_fffffffffffffe2a = SVOBitset::test(in_RDI,in_stack_fffffffffffffe2c),
           (bool)in_stack_fffffffffffffe2a)) {
          std::
          vector<std::optional<gss::innards::SVOBitset>,_std::allocator<std::optional<gss::innards::SVOBitset>_>_>
          ::operator[](&local_40,(ulong)*local_f0);
          std::optional<gss::innards::SVOBitset>::operator->
                    ((optional<gss::innards::SVOBitset> *)0x178a67);
          SVOBitset::reset(in_RDI,in_stack_fffffffffffffe2c);
          SVOBitset::reset(in_RDI,in_stack_fffffffffffffe2c);
          uVar5 = local_140->count - 1;
          local_140->count = uVar5;
          if (uVar5 == 0) {
            local_1 = 0;
            goto LAB_00178e4a;
          }
        }
        __gnu_cxx::
        __normal_iterator<gss::innards::HomomorphismDomain_*,_std::vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>_>
        ::operator++(&local_130);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
    ::operator++(&local_d0);
  }
  bVar1 = std::optional::operator_cast_to_bool
                    ((optional<gss::innards::HomomorphismAssignment> *)0x178b00);
  if (bVar1) {
    local_148 = (in_RDI->_data).short_data[0] + 0x30;
    local_150._M_current =
         (pair<unsigned_int,_unsigned_int> *)
         std::
         vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
         ::begin((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                  *)in_stack_fffffffffffffe08);
    local_158 = (pair<unsigned_int,_unsigned_int> *)
                std::
                vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                ::end((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                       *)in_stack_fffffffffffffe08);
    while (bVar1 = __gnu_cxx::
                   operator==<const_std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
                             ((__normal_iterator<const_std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
                               *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                              (__normal_iterator<const_std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
                               *)in_stack_fffffffffffffe08), ((bVar1 ^ 0xffU) & 1) != 0) {
      local_160 = __gnu_cxx::
                  __normal_iterator<const_std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
                  ::operator*(&local_150);
      local_168 = std::get<0ul,unsigned_int,unsigned_int>
                            ((pair<unsigned_int,_unsigned_int> *)0x178b89);
      local_170 = std::get<1ul,unsigned_int,unsigned_int>
                            ((pair<unsigned_int,_unsigned_int> *)0x178b9e);
      in_stack_fffffffffffffe24 = *local_170;
      pHVar3 = std::optional<gss::innards::HomomorphismAssignment>::operator->
                         ((optional<gss::innards::HomomorphismAssignment> *)0x178bc1);
      if (in_stack_fffffffffffffe24 == pHVar3->target_vertex) {
        local_171 = 0;
        local_180 = local_28;
        local_188._M_current =
             (HomomorphismDomain *)
             std::
             vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
             ::begin((vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
                      *)in_stack_fffffffffffffe08);
        local_190 = (HomomorphismDomain *)
                    std::
                    vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
                    ::end((vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
                           *)in_stack_fffffffffffffe08);
        while (bVar1 = __gnu_cxx::
                       operator==<gss::innards::HomomorphismDomain_*,_std::vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>_>
                                 ((__normal_iterator<gss::innards::HomomorphismDomain_*,_std::vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>_>
                                   *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                                  (__normal_iterator<gss::innards::HomomorphismDomain_*,_std::vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>_>
                                   *)in_stack_fffffffffffffe08), ((bVar1 ^ 0xffU) & 1) != 0) {
          local_198 = __gnu_cxx::
                      __normal_iterator<gss::innards::HomomorphismDomain_*,_std::vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>_>
                      ::operator*(&local_188);
          in_stack_fffffffffffffe20 = local_198->v;
          pHVar3 = std::optional<gss::innards::HomomorphismAssignment>::operator->
                             ((optional<gss::innards::HomomorphismAssignment> *)0x178c46);
          if (in_stack_fffffffffffffe20 < pHVar3->pattern_vertex) {
            bVar1 = SVOBitset::test(in_RDI,in_stack_fffffffffffffe2c);
            if (bVar1) {
              local_171 = 1;
            }
          }
          else {
            uVar5 = local_198->v;
            pHVar3 = std::optional<gss::innards::HomomorphismAssignment>::operator->
                               ((optional<gss::innards::HomomorphismAssignment> *)0x178c9e);
            if (pHVar3->pattern_vertex < uVar5) {
              bVar1 = SVOBitset::test(in_RDI,in_stack_fffffffffffffe2c);
              in_stack_fffffffffffffe14 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe14);
              if (bVar1) {
                std::
                vector<std::optional<gss::innards::SVOBitset>,_std::allocator<std::optional<gss::innards::SVOBitset>_>_>
                ::operator[](&local_40,(ulong)*local_168);
                std::optional<gss::innards::SVOBitset>::operator->
                          ((optional<gss::innards::SVOBitset> *)0x178cf6);
                SVOBitset::reset(in_RDI,in_stack_fffffffffffffe2c);
                SVOBitset::reset(in_RDI,in_stack_fffffffffffffe2c);
                uVar5 = local_198->count - 1;
                local_198->count = uVar5;
                if (uVar5 == 0) {
                  local_1 = 0;
                  goto LAB_00178e4a;
                }
              }
            }
          }
          __gnu_cxx::
          __normal_iterator<gss::innards::HomomorphismDomain_*,_std::vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>_>
          ::operator++(&local_188);
        }
        local_1a0 = local_20;
        local_1a8._M_current =
             (HomomorphismAssignmentInformation *)
             std::
             vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
             ::begin(in_stack_fffffffffffffe08);
        std::
        vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
        ::end(in_stack_fffffffffffffe08);
        while (bVar1 = __gnu_cxx::
                       operator==<const_gss::innards::HomomorphismAssignmentInformation_*,_std::vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>_>
                                 ((__normal_iterator<const_gss::innards::HomomorphismAssignmentInformation_*,_std::vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>_>
                                   *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                                  (__normal_iterator<const_gss::innards::HomomorphismAssignmentInformation_*,_std::vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>_>
                                   *)in_stack_fffffffffffffe08), ((bVar1 ^ 0xffU) & 1) != 0) {
          pHVar4 = __gnu_cxx::
                   __normal_iterator<const_gss::innards::HomomorphismAssignmentInformation_*,_std::vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>_>
                   ::operator*(&local_1a8);
          in_stack_fffffffffffffe10 = (pHVar4->assignment).pattern_vertex;
          pHVar3 = std::optional<gss::innards::HomomorphismAssignment>::operator->
                             ((optional<gss::innards::HomomorphismAssignment> *)0x178dcd);
          if ((in_stack_fffffffffffffe10 < pHVar3->pattern_vertex) &&
             (*local_168 == (pHVar4->assignment).target_vertex)) {
            local_171 = 1;
          }
          __gnu_cxx::
          __normal_iterator<const_gss::innards::HomomorphismAssignmentInformation_*,_std::vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>_>
          ::operator++(&local_1a8);
        }
        if ((local_171 & 1) == 0) {
          local_1 = 0;
          goto LAB_00178e4a;
        }
      }
      __gnu_cxx::
      __normal_iterator<const_std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
      ::operator++(&local_150);
    }
  }
  local_1 = 1;
LAB_00178e4a:
  local_11c = 1;
  std::
  vector<std::optional<gss::innards::SVOBitset>,_std::allocator<std::optional<gss::innards::SVOBitset>_>_>
  ::~vector((vector<std::optional<gss::innards::SVOBitset>,_std::allocator<std::optional<gss::innards::SVOBitset>_>_>
             *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
  return (bool)(local_1 & 1);
}

Assistant:

auto HomomorphismSearcher::propagate_occur_less_thans(
    const optional<HomomorphismAssignment> & current_assignment,
    const HomomorphismAssignments & assignments,
    Domains & new_domains) -> bool
{
    vector<optional<SVOBitset>> occurs(model.target_size);

    auto build_occurs = [&](int p) -> void {
        if (occurs[p])
            return;

        occurs[p] = make_optional<SVOBitset>(model.pattern_size, 0);
        for (auto & d : new_domains)
            if (d.values.test(p))
                occurs[p]->set(d.v);
    };

    for (auto & [a, b] : model.target_occur_less_thans_in_convenient_order) {
        build_occurs(a);
        build_occurs(b);
    }

    for (auto & a : assignments.values)
        if (occurs[a.assignment.target_vertex])
            occurs[a.assignment.target_vertex]->set(a.assignment.pattern_vertex);

    // propagate lower bounds
    for (auto & [a, b] : model.target_occur_less_thans_in_convenient_order) {
        auto first_a = occurs[a]->find_first();
        if (first_a == SVOBitset::npos) {
            // no occurrence of value a, value b cannot be used either
            occurs[b]->reset();
            for (auto & d : new_domains)
                if (d.values.test(b)) {
                    d.values.reset(b);
                    if (0 == --d.count)
                        return false;
                }
        }
        else {
            // value a first occurs in variable x, value b cannot be used in a variable lower than x
            for (auto & d : new_domains) {
                if (d.v < first_a && d.values.test(b)) {
                    occurs[b]->reset(d.v);
                    d.values.reset(b);
                    if (0 == --d.count)
                        return false;
                }
            }
        }
    }

    // propagate other way: if value b must occur (because it has been assigned) then
    // value a must go before
    if (current_assignment) {
        for (auto & [a, b] : model.target_occur_less_thans_in_convenient_order) {
            if (b != current_assignment->target_vertex)
                continue;

            bool saw_an_a = false;
            for (auto & d : new_domains) {
                if (d.v < current_assignment->pattern_vertex) {
                    // it's before
                    if (d.values.test(a))
                        saw_an_a = true;
                }
                else if (d.v > current_assignment->pattern_vertex) {
                    // comes after, can't use a
                    if (d.values.test(a)) {
                        occurs[a]->reset(d.v);
                        d.values.reset(a);
                        if (0 == --d.count)
                            return false;
                    }
                }
            }

            for (auto & d : assignments.values)
                if (d.assignment.pattern_vertex < current_assignment->pattern_vertex && a == d.assignment.target_vertex)
                    saw_an_a = true;

            if (! saw_an_a)
                return false;
        }
    }

    return true;
}